

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void mqtt_recv_consume(Curl_easy *data,size_t nbytes)

{
  MQTT *pMVar1;
  size_t sVar2;
  size_t rlen;
  MQTT *mq;
  size_t nbytes_local;
  Curl_easy *data_local;
  
  pMVar1 = (data->req).p.mqtt;
  sVar2 = Curl_dyn_len(&pMVar1->recvbuf);
  if (nbytes < sVar2) {
    Curl_dyn_tail(&pMVar1->recvbuf,sVar2 - nbytes);
  }
  else {
    Curl_dyn_reset(&pMVar1->recvbuf);
  }
  return;
}

Assistant:

static void mqtt_recv_consume(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = data->req.p.mqtt;
  size_t rlen = Curl_dyn_len(&mq->recvbuf);
  if(rlen <= nbytes)
    Curl_dyn_reset(&mq->recvbuf);
  else
    Curl_dyn_tail(&mq->recvbuf, rlen - nbytes);
}